

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O3

void __thiscall
INetwork::Forward(INetwork *this,Sample *sample,vector<float,_std::allocator<float>_> *output,
                 Time time)

{
  pointer pfVar1;
  ulong uVar2;
  float extraout_XMM0_Da;
  
  (**(code **)(*(long *)this->eventManager + 0x18))(this->eventManager,sample,&this->input);
  (**(code **)(*(long *)this->eventManager + 0x10))(time,this->eventManager,this->useSTDP);
  std::vector<float,_std::allocator<float>_>::resize
            (output,(long)(this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  if ((output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = 0;
    do {
      (*(this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2]->_vptr_INeuron[4])();
      pfVar1 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar1[uVar2] = extraout_XMM0_Da;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(output->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  (*this->_vptr_INetwork[6])(this);
  return;
}

Assistant:

void INetwork::Forward( const SPIKING_NN::Sample &sample, std::vector<float> &output, SPIKING_NN::Time time )
{
    eventManager->RegisterSample( sample, input );
    eventManager->RunSimulation( time, useSTDP );
    output.resize( this->output.size());
    for ( int neuronId = 0; neuronId < output.size(); ++neuronId ) {
        output[neuronId] = this->output[neuronId]->GetOutput();
    }
    Reset();
}